

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

double net_bw(char *iface,char *stage)

{
  byte *pbVar1;
  int iVar2;
  char *__s;
  size_t __n;
  char *pcVar3;
  ushort **ppuVar4;
  long lVar5;
  long lVar6;
  timeval t;
  sensor_slurp proc_net;
  timeval local_2050;
  double local_2040;
  undefined1 local_2038 [8];
  char local_2030 [8192];
  
  if (iface == (char *)0x0) {
    iface = "eth0";
  }
  __s = strdup(iface);
  memcpy(local_2038,&PTR_anon_var_dwarf_3df0a_00163aa8,0x2008);
  pcVar3 = local_2030;
  slurpfile("/proc/net/dev",pcVar3,0x2000);
  gettimeofday(&local_2050,(__timezone_ptr_t)0x0);
  __n = strlen(__s);
  while (iVar2 = strncmp(pcVar3,__s,__n), iVar2 != 0) {
    pcVar3 = skip_token(pcVar3);
    ppuVar4 = __ctype_b_loc();
    pcVar3 = pcVar3 + -1;
    do {
      pbVar1 = (byte *)(pcVar3 + 1);
      pcVar3 = pcVar3 + 1;
    } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  }
  pcVar3 = skip_token(pcVar3);
  ppuVar4 = __ctype_b_loc();
  pcVar3 = pcVar3 + -1;
  do {
    pbVar1 = (byte *)(pcVar3 + 1);
    pcVar3 = pcVar3 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
  iVar2 = 0;
  lVar5 = strtol(pcVar3,(char **)0x0,10);
  do {
    pcVar3 = skip_token(pcVar3);
    pcVar3 = pcVar3 + -1;
    do {
      pbVar1 = (byte *)(pcVar3 + 1);
      pcVar3 = pcVar3 + 1;
    } while ((*(byte *)((long)*ppuVar4 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 8);
  lVar6 = strtol(pcVar3,(char **)0x0,10);
  free(__s);
  if (((*stage == 's') && (stage[1] == 't')) && (stage[2] == 'a')) {
    printf("Start %ld %ld \n",lVar6,lVar5);
    net_bw::start_time = local_2050.tv_sec * 1000000 + local_2050.tv_usec;
    local_2040 = 0.0;
    net_bw::old_s_bytes = lVar6;
    net_bw::old_r_bytes = lVar5;
  }
  else {
    printf("End %ld %ld \n",lVar6,lVar5);
    local_2040 = ((double)((lVar6 + lVar5) - (net_bw::old_s_bytes + net_bw::old_r_bytes)) /
                 (double)((local_2050.tv_sec * 1000000 + local_2050.tv_usec) - net_bw::start_time))
                 * 1000000.0 * 8.0;
    printf("Bandwidth = %f\n");
  }
  return local_2040;
}

Assistant:

double net_bw(char *iface, char *stage)
{
	static long old_s_bytes, new_s_bytes, old_r_bytes, new_r_bytes, start_time, end_time;
	long s_bytes, r_bytes;
	struct timeval t;
	double net_bw;
#ifdef HAVE_MAC_SYSCTL
	char *buf = NULL, *lim, *next;
	static int mib[6];
  	size_t mlen,vlen;
	struct if_msghdr *ifm;
	unsigned int ifindex;
  	mib[0] = CTL_NET;
  	mib[1] = PF_ROUTE;
	mib[2] = 0;
	mib[3] = 0;
	mib[4] = NET_RT_IFLIST;
	mib[5] = 0;
	
	mlen = 6;
	ifindex = if_nametoindex(iface);
	sysctl(mib,mlen,NULL,&vlen,NULL,0);
	buf = malloc(vlen);
	sysctl(mib,mlen,buf,&vlen,NULL,0);
	lim = buf+vlen;
	for(next = buf; next < lim; )
	{	
		ifm = (struct if_msghdr *)next;
		next += ifm->ifm_msglen;
	//	printf("Index %d, ifm index %d\n",ifindex,ifm->ifm_index);
	//	printf("ibytes %ld\n",ifm->ifm_data.ifi_ibytes);
		if(ifindex == ifm->ifm_index)
		{
	//		printf("Correct interface\n");
			r_bytes = (long) ifm->ifm_data.ifi_ibytes;
			s_bytes = (long) ifm->ifm_data.ifi_obytes;
			break;
		}
	}
//	printf("Received bytes %ld Sent bytes %ld\n",r_bytes,s_bytes);
	free(buf);
	
#else

	int i=0;
	char *temp_if;
	char *p;

	if(iface == NULL)
		temp_if = strdup("eth0");
	else
		temp_if = strdup((const char*)iface);
	sensor_slurp proc_net = { "/proc/net/dev" };
        p = update_file(&proc_net);
#ifndef HAVE_WINDOWS_H
	gettimeofday(&t, NULL);
#else
	/* GSE...  No gettimeofday on windows.
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */

	struct _timeb nowb;
	_ftime(&nowb);
	t.tv_sec = (long)nowb.time;
	t.tv_usec = nowb.millitm * 1000;
#endif
        while (p && strncmp(p,temp_if,strlen(temp_if)))
        {
                p = skip_token(p);
                p = skip_whitespace(p);
        }
	
        p = skip_token(p);
        p = skip_whitespace(p);
        r_bytes = strtol( p ,NULL,10);
	while(i <= 7) {
                p = skip_token(p);
                p = skip_whitespace(p);
                ++i;
        }
	s_bytes = strtol (p, NULL,10);
	free(temp_if);
#endif // end HAVE_MAC_SYSCTL
	if(strncmp(stage,"start",3)==0)
	{
		printf("Start %ld %ld \n",s_bytes,r_bytes);
		
		old_s_bytes = s_bytes;
		old_r_bytes = r_bytes;
		start_time = t.tv_sec * 1000000 + t.tv_usec;

		return 0.0;
	}
	printf("End %ld %ld \n",s_bytes,r_bytes);
	new_s_bytes = s_bytes;
	new_r_bytes = r_bytes;
	end_time = t.tv_sec * 1000000 + t.tv_usec;
	net_bw = (double) (((new_s_bytes - old_s_bytes) + (new_r_bytes - old_r_bytes)) / (double)(end_time - start_time))*1000000*8;
	printf("Bandwidth = %f\n",net_bw);
	return net_bw;			
	
}